

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addr.h
# Opt level: O0

void __thiscall mocker::nasm::Label::~Label(Label *this)

{
  Label *this_local;
  
  ~Label(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit Label(std::string name) : name(std::move(name)) {}